

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

void load_area(FILE *fp)

{
  short sVar1;
  int iVar2;
  AREA_DATA_conflict *pAVar3;
  char *pcVar4;
  
  pAVar3 = (AREA_DATA_conflict *)operator_new(0x170);
  pcVar4 = fread_string(fp);
  pAVar3->file_name = pcVar4;
  pAVar3->prev = (AREA_DATA_conflict *)0x0;
  zero_vector(pAVar3->area_flags);
  *(byte *)pAVar3->area_flags = (byte)pAVar3->area_flags[0] | 0x20;
  pAVar3->vnum = top_area;
  pAVar3->affected = (AREA_AFFECT_DATA *)0x0;
  pcVar4 = fread_string(fp);
  pAVar3->name = pcVar4;
  pcVar4 = fread_string(fp);
  pAVar3->credits = pcVar4;
  iVar2 = fread_number(fp);
  pAVar3->low_range = (short)iVar2;
  iVar2 = fread_number(fp);
  pAVar3->high_range = (short)iVar2;
  iVar2 = fread_number(fp);
  pAVar3->min_vnum = (short)iVar2;
  iVar2 = fread_number(fp);
  pAVar3->max_vnum = (short)iVar2;
  fread_word(fp);
  sVar1 = flag_lookup(fread_word::word,(flag_type *)&area_type_table);
  pAVar3->area_type = sVar1;
  fread_word(fp);
  sVar1 = climate_lookup(fread_word::word);
  pAVar3->climate = sVar1;
  fread_flag_new(pAVar3->area_flags,fp);
  iVar2 = fread_number(fp);
  pAVar3->security = iVar2;
  pcVar4 = fread_string(fp);
  pAVar3->builders = pcVar4;
  pAVar3->age = 0xf;
  pAVar3->nplayer = 0;
  pAVar3->empty = false;
  zero_vector(pAVar3->affected_by);
  zero_vector(pAVar3->progtypes);
  pAVar3->aprogs = (APROG_DATA *)0x0;
  pAVar3->sky = 0;
  pAVar3->temp = 0;
  if (_area_first == (AREA_DATA_conflict *)0x0) {
    _area_first = pAVar3;
  }
  if (area_last != (AREA_DATA_conflict *)0x0) {
    area_last->next = pAVar3;
    pAVar3->prev = area_last;
    *(byte *)area_last->area_flags = (byte)area_last->area_flags[0] & 0xdf;
  }
  area_last = pAVar3;
  pAVar3->next = (AREA_DATA_conflict *)0x0;
  top_area = top_area + 1;
  return;
}

Assistant:

void load_area(FILE *fp)
{
	AREA_DATA *pArea;

	pArea = new AREA_DATA;
	/*
	pArea->reset_first	= nullptr;
	pArea->reset_last	= nullptr;
	*/
	pArea->file_name = fread_string(fp);

	pArea->prev = nullptr;

	zero_vector(pArea->area_flags);
	SET_BIT(pArea->area_flags, AREA_LOADING); /* OLC */
	pArea->vnum = top_area;					  /* OLC */
	pArea->affected = nullptr;
	pArea->name = fread_string(fp);
	pArea->credits = fread_string(fp);
	pArea->low_range = fread_number(fp);
	pArea->high_range = fread_number(fp);
	pArea->min_vnum = fread_number(fp);
	pArea->max_vnum = fread_number(fp);
	pArea->area_type = flag_lookup(fread_word(fp), area_type_table);
	pArea->climate = climate_lookup(fread_word(fp));
	fread_flag_new(pArea->area_flags, fp);

	pArea->security = fread_number(fp);
	pArea->builders = fread_string(fp);
	pArea->age = 15;
	pArea->nplayer = 0;
	pArea->empty= false;
	pArea->nplayer = 0;
	zero_vector(pArea->affected_by);

	/* Morg - Valgrind fix. */
	zero_vector(pArea->progtypes);
	pArea->aprogs = nullptr;
	pArea->temp = 0;
	pArea->sky = 0;

	if (!area_first)
		area_first = pArea;

	if (area_last)
	{
		area_last->next = pArea;
		pArea->prev = area_last;

		REMOVE_BIT(area_last->area_flags, AREA_LOADING); /* OLC */
	}

	area_last = pArea;
	pArea->next = nullptr;

	top_area++;
}